

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNotationDecl.cpp
# Opt level: O1

XSerializable * xercesc_4_0::XMLNotationDecl::createObject(MemoryManager *manager)

{
  XMLNotationDecl *this;
  
  this = (XMLNotationDecl *)XMemory::operator_new(0x40,manager);
  XMLNotationDecl(this,manager);
  return &this->super_XSerializable;
}

Assistant:

void XMLNotationDecl::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {
        serEng.writeSize (fId);
        serEng<<fNameSpaceId;
        serEng.writeString(fName);
        serEng.writeString(fPublicId);
        serEng.writeString(fSystemId);
        serEng.writeString(fBaseURI);
    }
    else
    {
        serEng.readSize (fId);
        serEng>>fNameSpaceId;
        serEng.readString(fName);
        serEng.readString(fPublicId);
        serEng.readString(fSystemId);
        serEng.readString(fBaseURI);
    }
}